

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O1

void __thiscall
raft_functional_common::TestSm::create_snapshot(TestSm *this,snapshot *s,handler_type *when_done)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  ptr<std::exception> except;
  bool ret;
  shared_ptr<std::exception> local_48;
  element_type *local_38;
  element_type *peStack_30;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lastSnapshotLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  nuraft::snapshot::serialize((snapshot *)&local_48);
  nuraft::snapshot::deserialize
            ((snapshot *)&local_38,
             (buffer *)
             local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar2 = peStack_30;
  peVar1 = local_38;
  local_38 = (element_type *)0x0;
  peStack_30 = (element_type *)0x0;
  this_00 = (this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (peStack_30 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_30);
  }
  if (local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lastSnapshotLock);
  local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = (element_type *)CONCAT71(local_38._1_7_,1);
  if ((when_done->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*when_done->_M_invoker)((_Any_data *)when_done,(bool *)&local_38,&local_48);
    if (local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void create_snapshot(snapshot& s,
                         async_result<bool>::handler_type& when_done)
    {
        {   std::lock_guard<std::mutex> ll(lastSnapshotLock);
            // NOTE: We only handle logical snapshot.
            ptr<buffer> snp_buf = s.serialize();
            lastSnapshot = snapshot::deserialize(*snp_buf);
        }
        ptr<std::exception> except(nullptr);
        bool ret = true;
        when_done(ret, except);
    }